

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

uv_loop_t * uv_loop_new(void)

{
  int iVar1;
  uv_loop_t *loop;
  
  loop = (uv_loop_t *)uv__malloc(0x328);
  if (loop == (uv_loop_t *)0x0) {
    loop = (uv_loop_t *)0x0;
  }
  else {
    iVar1 = uv_loop_init(loop);
    if (iVar1 != 0) {
      uv__free(loop);
      loop = (uv_loop_t *)0x0;
    }
  }
  return loop;
}

Assistant:

uv_loop_t* uv_loop_new(void) {
  uv_loop_t* loop;

  loop = uv__malloc(sizeof(*loop));
  if (loop == NULL)
    return NULL;

  if (uv_loop_init(loop)) {
    uv__free(loop);
    return NULL;
  }

  return loop;
}